

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_StArrGeneric<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  code *pcVar1;
  bool bVar2;
  uint index_00;
  undefined4 *puVar3;
  uint32 index;
  OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  index_00 = GetRegRawInt<unsigned_int>(this,playout->SlotIndex);
  switch(playout->ViewType) {
  case TYPE_INT8:
    OP_StArr<char,int>(this,index_00,playout->Value);
    break;
  case TYPE_UINT8:
    OP_StArr<unsigned_char,int>(this,index_00,playout->Value);
    break;
  case TYPE_INT16:
    OP_StArr<short,int>(this,index_00 & 0xfffffffe,playout->Value);
    break;
  case TYPE_UINT16:
    OP_StArr<unsigned_short,int>(this,index_00 & 0xfffffffe,playout->Value);
    break;
  case TYPE_INT32:
    OP_StArr<int,int>(this,index_00 & 0xfffffffc,playout->Value);
    break;
  case TYPE_UINT32:
    OP_StArr<unsigned_int,int>(this,index_00 & 0xfffffffc,playout->Value);
    break;
  case TYPE_FLOAT32:
    OP_StArr<float,float>(this,index_00 & 0xfffffffc,playout->Value);
    break;
  case TYPE_FLOAT64:
    OP_StArr<double,double>(this,index_00 & 0xfffffff8,playout->Value);
    break;
  case TYPE_INT64:
    OP_StArr<long,long>(this,index_00 & 0xfffffff8,playout->Value);
    break;
  case TYPE_INT8_TO_INT64:
    OP_StArr<char,long>(this,index_00,playout->Value);
    break;
  case TYPE_UINT8_TO_INT64:
    OP_StArr<unsigned_char,long>(this,index_00,playout->Value);
    break;
  case TYPE_INT16_TO_INT64:
    OP_StArr<short,long>(this,index_00 & 0xfffffffe,playout->Value);
    break;
  case TYPE_UINT16_TO_INT64:
    OP_StArr<unsigned_short,long>(this,index_00 & 0xfffffffe,playout->Value);
    break;
  case TYPE_INT32_TO_INT64:
    OP_StArr<int,long>(this,index_00 & 0xfffffffc,playout->Value);
    break;
  case TYPE_UINT32_TO_INT64:
    OP_StArr<unsigned_int,long>(this,index_00 & 0xfffffffc,playout->Value);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x23a3,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_StArrGeneric(const unaligned T* playout)
    {
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_StArr<MemType, RegType>(index & ARRAYBUFFER_VIEW_MASK(align), playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }